

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12Platform.cpp
# Opt level: O2

uint8_t __thiscall
GmmLib::PlatformInfoGen12::CheckFmtDisplayDecompressible
          (PlatformInfoGen12 *this,GMM_TEXTURE_INFO *Surf,bool IsSupportedRGB64_16_16_16_16,
          bool IsSupportedRGB32_8_8_8_8,bool IsSupportedRGB32_2_10_10_10,
          bool IsSupportedMediaFormats)

{
  anon_struct_8_44_94931171_for_Info aVar1;
  
  aVar1 = (Surf->Flags).Info;
  return (((ulong)aVar1 & 0x106000000000) == 0 && ((ulong)aVar1 & 0x81000000000) != 0) &
         ((byte)((ulong)aVar1 >> 0x14) & IsSupportedMediaFormats |
         (((ulong)aVar1 & 0x200020100000) != 0x200000000000 &&
         ((IsSupportedRGB64_16_16_16_16 || IsSupportedRGB32_8_8_8_8) || IsSupportedRGB32_2_10_10_10)
         ));
}

Assistant:

uint8_t GmmLib::PlatformInfoGen12::CheckFmtDisplayDecompressible(GMM_TEXTURE_INFO &Surf,
                                                                 bool              IsSupportedRGB64_16_16_16_16,
                                                                 bool              IsSupportedRGB32_8_8_8_8,
                                                                 bool              IsSupportedRGB32_2_10_10_10,
                                                                 bool              IsSupportedMediaFormats)
{

    //Check fmt is display decompressible
    if (((Surf.Flags.Info.RenderCompressed || Surf.Flags.Info.MediaCompressed || !Surf.Flags.Info.NotCompressed) &&
        (IsSupportedRGB64_16_16_16_16 ||                             //RGB64 16:16 : 16 : 16 FP16
         IsSupportedRGB32_8_8_8_8 ||                                 //RGB32 8 : 8 : 8 : 8
         IsSupportedRGB32_2_10_10_10)) ||                            //RGB32 2 : 10 : 10 : 10) ||
       (Surf.Flags.Info.MediaCompressed && IsSupportedMediaFormats)) //YUV444 - Y412, Y416
    {
        //Display supports compression on TileY, but not Yf/Ys (deprecated for display support)
        if(GMM_IS_4KB_TILE(Surf.Flags) &&
           !(Surf.Flags.Info.TiledYf || GMM_IS_64KB_TILE(Surf.Flags)))
        {
            return true;
        }
    }
    return false;
}